

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
randomx::AssemblyGeneratorX86::genAddressReg
          (AssemblyGeneratorX86 *this,Instruction *instr,char *reg)

{
  uint32_t uVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  char *in_RDX;
  int iVar5;
  Instruction *in_RSI;
  long in_RDI;
  
  poVar3 = std::operator<<((ostream *)(in_RDI + 0x10),"\tlea ");
  poVar3 = std::operator<<(poVar3,in_RDX);
  poVar3 = std::operator<<(poVar3,", [");
  poVar3 = std::operator<<(poVar3,*(char **)(regR32 + (ulong)in_RSI->src * 8));
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::showpos);
  uVar1 = Instruction::getImm32((Instruction *)0x114225);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,uVar1);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::noshowpos);
  poVar3 = std::operator<<(poVar3,"]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)(in_RDI + 0x10),"\tand ");
  poVar3 = std::operator<<(poVar3,in_RDX);
  poVar3 = std::operator<<(poVar3,", ");
  iVar2 = Instruction::getModMem(in_RSI);
  iVar5 = 0x3fff8;
  if (iVar2 != 0) {
    iVar5 = 0x3ff8;
  }
  pvVar4 = (void *)std::ostream::operator<<(poVar3,iVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void AssemblyGeneratorX86::genAddressReg(Instruction& instr, const char* reg = "eax") {
		asmCode << "\tlea " << reg << ", [" << regR32[instr.src] << std::showpos << (int32_t)instr.getImm32() << std::noshowpos << "]" << std::endl;
		asmCode << "\tand " << reg << ", " << ((instr.getModMem()) ? ScratchpadL1Mask : ScratchpadL2Mask) << std::endl;
	}